

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtype-exprs.h
# Opt level: O0

void __thiscall
wasm::SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping>::visitArrayNewFixed
          (SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping> *this,ArrayNewFixed *curr)

{
  Expression *sub;
  bool bVar1;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this_00;
  Expression **ppEVar2;
  Unsubtyping *this_01;
  Expression *value;
  Iterator __end2;
  Iterator __begin2;
  ExpressionList *__range2;
  Type local_28;
  Array array;
  ArrayNewFixed *curr_local;
  SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping> *this_local;
  
  array.element._8_8_ = curr;
  bVar1 = wasm::Type::isArray(&(curr->super_SpecificExpression<(wasm::Expression::Id)73>).
                               super_Expression.type);
  if (bVar1) {
    wasm::Type::getHeapType((Type *)(array.element._8_8_ + 8));
    HeapType::getArray((HeapType *)&local_28);
    this_00 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
              (array.element._8_8_ + 0x10);
    join_0x00000010_0x00000000_ =
         ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin(this_00);
    _value = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end(this_00);
    while (bVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator!=((Iterator *)&__end2.index,(Iterator *)&value), bVar1) {
      ppEVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                operator*((Iterator *)&__end2.index);
      sub = *ppEVar2;
      this_01 = self(this);
      anon_unknown_22::Unsubtyping::noteSubtype(this_01,sub,local_28);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end2.index);
    }
  }
  return;
}

Assistant:

void visitArrayNewFixed(ArrayNewFixed* curr) {
    if (!curr->type.isArray()) {
      return;
    }
    auto array = curr->type.getHeapType().getArray();
    for (auto* value : curr->values) {
      self()->noteSubtype(value, array.element.type);
    }
  }